

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O2

void OpenMesh::IO::assignCustomProperty<unsigned_short>
               (istream *_in,BaseImporter *_bi,VertexHandle _vh,string *_propName)

{
  bool bVar1;
  undefined4 in_EAX;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference pvVar3;
  value_type local_36;
  VPropHandleT<unsigned_short> local_34;
  unsigned_short in;
  VPropHandleT<unsigned_short> prop;
  
  iVar2 = (*_bi->_vptr_BaseImporter[0x19])(_bi);
  bVar1 = BaseKernel::get_property_handle<unsigned_short>
                    ((BaseKernel *)CONCAT44(extraout_var,iVar2),&local_34,_propName);
  if (!bVar1) {
    iVar2 = (*_bi->_vptr_BaseImporter[0x19])(_bi);
    BaseKernel::add_property<unsigned_short>
              ((BaseKernel *)CONCAT44(extraout_var_00,iVar2),&local_34,_propName);
  }
  std::istream::_M_extract<unsigned_short>((ushort *)_in);
  local_36 = (value_type)((uint)in_EAX >> 0x10);
  iVar2 = (*_bi->_vptr_BaseImporter[0x19])(_bi);
  pvVar3 = BaseKernel::property<unsigned_short>
                     ((BaseKernel *)CONCAT44(extraout_var_01,iVar2),
                      (VPropHandleT<unsigned_short>)0xffffffff,_vh);
  *pvVar3 = local_36;
  return;
}

Assistant:

void assignCustomProperty(std::istream& _in, BaseImporter& _bi, VertexHandle _vh, const std::string& _propName)
{
  OpenMesh::VPropHandleT<T> prop;
  if (!_bi.kernel()->get_property_handle(prop,_propName))
    _bi.kernel()->add_property(prop,_propName);
  T in;
  _in >> in;
  _bi.kernel()->property(prop,_vh) = in;
}